

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchmanager.cpp
# Opt level: O2

void __thiscall QEvdevTouchManager::updateInputDeviceCount(QEvdevTouchManager *this)

{
  pointer pDVar1;
  bool bVar2;
  QLoggingCategory *pQVar3;
  long lVar4;
  uint uVar5;
  Device *device;
  pointer pDVar6;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->m_activeDevices).v.
           super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = 0;
  for (pDVar6 = (this->m_activeDevices).v.
                super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>
                ._M_impl.super__Vector_impl_data._M_start; pDVar6 != pDVar1; pDVar6 = pDVar6 + 1) {
    bVar2 = QEvdevTouchScreenHandlerThread::isPointingDeviceRegistered
                      ((QEvdevTouchScreenHandlerThread *)
                       (pDVar6->handler)._M_t.
                       super___uniq_ptr_impl<QEvdevTouchScreenHandlerThread,_std::default_delete<QEvdevTouchScreenHandlerThread>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QEvdevTouchScreenHandlerThread_*,_std::default_delete<QEvdevTouchScreenHandlerThread>_>
                       .super__Head_base<0UL,_QEvdevTouchScreenHandlerThread_*,_false>._M_head_impl)
    ;
    uVar5 = uVar5 + bVar2;
  }
  pQVar3 = QtPrivateLogging::qLcEvdevTouch();
  if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_30 = pQVar3->name;
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    QMessageLogger::debug
              (local_48,
               "evdevtouch: Updating QInputDeviceManager device count: %d touch devices, %d pending handler(s)"
               ,(ulong)uVar5,
               (ulong)((int)((ulong)((long)(this->m_activeDevices).v.
                                           super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->m_activeDevices).v.
                                          super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::Device>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 5) - uVar5))
    ;
  }
  lVar4 = QGuiApplicationPrivate::inputDeviceManager();
  QInputDeviceManagerPrivate::setDeviceCount((DeviceType)*(undefined8 *)(lVar4 + 8),3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevTouchManager::updateInputDeviceCount()
{
    int registeredTouchDevices = 0;
    for (const auto &device : m_activeDevices) {
        if (device.handler->isPointingDeviceRegistered())
            ++registeredTouchDevices;
    }

    qCDebug(qLcEvdevTouch, "evdevtouch: Updating QInputDeviceManager device count: %d touch devices, %d pending handler(s)",
            registeredTouchDevices, m_activeDevices.count() - registeredTouchDevices);

    QInputDeviceManagerPrivate::get(QGuiApplicationPrivate::inputDeviceManager())->setDeviceCount(
        QInputDeviceManager::DeviceTypeTouch, registeredTouchDevices);
}